

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# injection.cpp
# Opt level: O1

int main(void)

{
  type tmp;
  uint16_t uVar1;
  int __fd;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  char *pcVar5;
  size_t sVar6;
  long *plVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  string message;
  array<unsigned_char,_26UL> pseudo;
  sockaddr_ll source_addr;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  ushort uStack_d0;
  undefined4 uStack_ce;
  undefined2 uStack_ca;
  undefined2 uStack_c8;
  undefined4 uStack_c6;
  undefined2 uStack_c2;
  ushort uStack_c0;
  undefined2 uStack_be;
  char cStack_bc;
  char cStack_bb;
  ushort uStack_ba;
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  undefined8 local_98;
  undefined1 uStack_90;
  undefined1 uStack_8f;
  undefined2 uStack_8e;
  undefined4 uStack_8c;
  undefined2 uStack_88;
  undefined2 uStack_86;
  undefined6 uStack_84;
  uint8_t local_7e [6];
  sockaddr local_78;
  undefined4 local_68;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  __fd = socket(0x11,3,0xff);
  if (__fd < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_1107c,0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
    return 1;
  }
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  local_58 = 0x6f6c;
  uStack_54 = 0;
  uStack_50 = 0;
  uStack_4c = 0;
  iVar2 = ioctl(__fd,0x8933);
  if (iVar2 < 0) {
    plVar7 = &std::cout;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_110b4,0x2d);
    lVar8 = std::cout;
  }
  else {
    local_78.sa_data[6] = '\0';
    local_78.sa_data[7] = '\0';
    local_78.sa_data[8] = '\0';
    local_78.sa_data[9] = '\0';
    local_78.sa_data[10] = '\0';
    local_78.sa_data[0xb] = '\0';
    local_78.sa_data[0xc] = '\0';
    local_78.sa_data[0xd] = '\0';
    local_68 = 0;
    local_78.sa_data._2_4_ = (undefined4)local_48;
    local_78._0_4_ = 0x3000011;
    iVar2 = bind(__fd,&local_78,0x14);
    if (-1 < iVar2) {
      local_e8 = 0;
      uStack_d0 = 0;
      uStack_c6 = 0;
      uStack_c2 = 0;
      uStack_c0 = 0;
      uStack_be = 0;
      cStack_bc = 0;
      cStack_bb = 0;
      uStack_ba = 0;
      uStack_e0 = 0x45000800000000;
      local_d8 = 0x1140004000002200;
      uStack_ce = 0x202a8c0;
      uStack_ca = 0xa8c0;
      uStack_c8 = 0x102;
      uVar1 = rudp::checksum((uint8_t *)((long)&uStack_e0 + 6),(uint8_t *)&uStack_c6);
      uStack_d0 = uVar1 << 8 | uVar1 >> 8;
      uStack_90 = 0;
      uStack_8c = 0;
      uStack_88 = 0;
      uStack_86 = 0;
      uStack_84 = 0;
      local_98 = CONCAT26(uStack_c8,CONCAT24(uStack_ca,uStack_ce));
      uStack_8f = local_d8._7_1_;
      uStack_8e = 0xe00;
      uStack_c6 = 0x401f401f;
      uStack_c2 = 0xe00;
      bVar11 = false;
      iVar10 = 0;
      iVar9 = 0;
      do {
        uStack_be = 0x650;
        cStack_bc = (char)iVar9;
        cStack_bb = cStack_bc + -1;
        uStack_ba = 0;
        uVar1 = rudp::checksum((uint8_t *)&uStack_be,(uint8_t *)&local_b8);
        uStack_ba = uVar1 << 8 | uVar1 >> 8;
        uStack_c0 = 0;
        uStack_84 = CONCAT24(uStack_ba,CONCAT13(cStack_bb,CONCAT12(cStack_bc,uStack_be)));
        uStack_8c = uStack_c6;
        uStack_88 = uStack_c2;
        uStack_86 = 0;
        uVar1 = rudp::checksum((uint8_t *)&local_98,local_7e);
        uStack_c0 = uVar1 << 8 | uVar1 >> 8;
        local_d8._0_4_ = CONCAT22((ushort)iVar9 << 8 | (ushort)iVar9 >> 8,(undefined2)local_d8);
        uStack_d0 = 0;
        uVar1 = rudp::checksum((uint8_t *)((long)&uStack_e0 + 6),(uint8_t *)&uStack_c6);
        uStack_d0 = uVar1 << 8 | uVar1 >> 8;
        local_b8 = &local_a8;
        local_b0 = 0;
        local_a8 = 0;
        sVar3 = write(__fd,&local_e8,0x30);
        if (sVar3 < 0) {
          piVar4 = __errno_location();
          pcVar5 = strerror(*piVar4);
          if (pcVar5 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x105070);
          }
          else {
            sVar6 = strlen(pcVar5);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar6);
          }
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
          std::ostream::put('p');
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,anon_var_dwarf_11107,0x13);
          plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
          std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
          std::ostream::put((char)plVar7);
          std::ostream::flush();
          iVar10 = 1;
          close(__fd);
        }
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
        }
        if (sVar3 < 0) break;
        iVar9 = iVar9 + 1;
        bVar11 = iVar9 == 0x100;
      } while (!bVar11);
      if (!bVar11) {
        return iVar10;
      }
      goto LAB_00101880;
    }
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x105070);
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_110ca,0x11);
    plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    lVar8 = *plVar7;
  }
  std::ios::widen((char)*(undefined8 *)(lVar8 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
LAB_00101880:
  close(__fd);
  return 1;
}

Assistant:

int main() {
  int sock = socket( AF_PACKET, SOCK_RAW, IPPROTO_RAW );
  if (sock < 0) {
    std::cout << "ソケットを開けない" << std::endl;
    return 1;
  }
  ifreq interface;
  memset( &interface, 0, sizeof( interface ) );
  strncpy( interface.ifr_name, "lo", IFNAMSIZ );
  if( ioctl( sock, SIOCGIFINDEX, &interface ) < 0 ) {
    std::cout << "インターフェースが見つからない" << std::endl;
    close( sock );
    return 1;
  }
  sockaddr_ll source_addr;
  memset( &source_addr, 0, sizeof( sockaddr_ll ) );
  source_addr.sll_family = AF_PACKET;
  source_addr.sll_protocol = htons( ETH_P_ALL );
  source_addr.sll_ifindex = interface.ifr_ifindex;
  const auto bind_result = bind( sock, reinterpret_cast< sockaddr* >( &source_addr ), sizeof( sockaddr_ll ) );
  if( bind_result < 0 ) {
    std::cout << strerror( errno ) << std::endl;
    std::cout << "bindできない " << bind_result << std::endl;
    close( sock );
    return 1;
  }
  constexpr size_t ether_header_size = 14;
  constexpr size_t ip_header_size = 20;
  constexpr size_t udp_header_size = 8;
  constexpr size_t rudp_header_size = 6;
  constexpr size_t pseudo_header_size = 12;
  constexpr size_t ether_offset = 0;
  constexpr size_t ip_offset = ether_header_size;
  constexpr size_t udp_offset = ip_offset + ip_header_size;
  constexpr size_t rudp_offset = udp_offset + udp_header_size;
  constexpr size_t total_packet_size = rudp_offset + rudp_header_size;
  constexpr size_t pseudo_ip_offset = 0;
  constexpr size_t pseudo_udp_offset = pseudo_ip_offset + pseudo_header_size;
  constexpr size_t pseudo_rudp_offset = pseudo_udp_offset + udp_header_size;
  constexpr size_t total_pseudo_packet_size = pseudo_rudp_offset + rudp_header_size;
  constexpr size_t ether_payload_size = ip_header_size + udp_header_size + rudp_header_size;
  constexpr size_t ip_payload_size = udp_header_size + rudp_header_size;
  constexpr size_t udp_payload_size = rudp_header_size;
  namespace karma = boost::spirit::karma;
  std::array< uint8_t, total_packet_size > buf;
  std::fill( buf.begin(), buf.end(), 0 );
  std::array< uint8_t, 6 > mac{ 0x00, 0x00, 0x00, 0x00, 0x00, 0x00 };
  std::copy( mac.begin(), mac.end(), buf.begin() );
  std::copy( mac.begin(), mac.end(), std::next( buf.begin(), 6 ) );
  buf[ 12 ] = 0x08;
  buf[ 13 ] = 0x00;ether_payload_size & 0xFF;
  auto ip_header = reinterpret_cast< iphdr* >( std::next( buf.data(), ip_offset ) );
  ip_header->version = 4;
  ip_header->ihl = 5;
  ip_header->tot_len = htons( ether_payload_size );
  ip_header->ttl = 0x40;
  ip_header->protocol = 0x11;
  ip_header->frag_off = htons( 0x02 << 13 );
  ip_header->saddr = htonl( ( 192 << 24 ) | ( 168 << 16 ) | ( 2 << 8 ) | 2 );
  ip_header->daddr = htonl( ( 192 << 24 ) | ( 168 << 16 ) | ( 2 << 8 ) | 1 );
  uint16_t c0 = rudp::checksum( std::next( buf.begin(), ip_offset ), std::next( buf.begin(), ip_offset + ip_header_size ) );
  ip_header->check = htons( c0 );
  std::array< uint8_t, total_pseudo_packet_size > pseudo;
  std::fill( pseudo.begin(), pseudo.end(), 0 );
  auto pseudo_header = reinterpret_cast< pseudo_header_t* >( std::next( pseudo.data(), pseudo_ip_offset ) );
  pseudo_header->saddr = ip_header->saddr;
  pseudo_header->daddr = ip_header->daddr;
  pseudo_header->protocol = ip_header->protocol;
  pseudo_header->tot_len = htons( udp_header_size + rudp_header_size );
  auto udp_header = reinterpret_cast< udphdr* >( std::next( buf.data(), udp_offset ) );
  udp_header->uh_sport = htons( port );
  udp_header->uh_dport = htons( port );
  udp_header->uh_ulen = htons( udp_header_size + rudp_header_size );
  auto rudp_header = std::next( buf.begin(), rudp_offset );
  for( unsigned int seq = 0; seq != 256u; ++seq ) {
    rudp_header[ 0 ] = 0x50;
    rudp_header[ 1 ] = 0x06;
    rudp_header[ 2 ] = uint8_t( seq );
    rudp_header[ 3 ] = uint8_t( seq - 1 );
    karma::generate( std::next( rudp_header, 4 ), karma::big_word, 0x0000 );
    uint16_t c2 = rudp::checksum( rudp_header, buf.end() );
    karma::generate( std::next( rudp_header, 4 ), karma::big_word, c2 );
    udp_header->uh_sum = 0;
    std::copy( std::next( buf.begin(), udp_offset ), buf.end(), std::next( pseudo.begin(), pseudo_udp_offset ) );
    uint16_t c1 = rudp::checksum( pseudo.begin(), pseudo.end() );
    udp_header->uh_sum = htons( c1 );
    ip_header->id = htons( seq );
    ip_header->check = 0;
    uint16_t c0 = rudp::checksum( std::next( buf.begin(), ip_offset ), std::next( buf.begin(), ip_offset + ip_header_size ) );
    ip_header->check = htons( c0 );
    std::string message;
    if( write( sock, buf.data(), buf.size() ) < 0 ) {
      std::cout << strerror( errno ) << std::endl;
      std::cout << "送信できない " << bind_result << std::endl;
      close( sock );
      return 1;
    }
  }
  close( sock );
  return 1;
}